

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O1

void UnityAssertEqualMemory
               (void *expected,void *actual,UNITY_UINT32 length,UNITY_UINT32 num_elements,char *msg,
               UNITY_UINT lineNumber,UNITY_FLAGS_T flags)

{
  int iVar1;
  long lVar2;
  UNITY_UINT number;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  UNITY_UINT32 UVar6;
  
  if (Unity.CurrentTestIgnored == 0 && Unity.CurrentTestFailed == 0) {
    if ((length == 0) || (num_elements == 0)) {
      UnityTestResultsFailBegin(lineNumber);
      UnityPrint(" You Asked Me To Compare Nothing, Which Was Pointless.");
LAB_00102c1d:
      UnityAddMsgIfSpecified(msg);
    }
    else {
      if (expected == actual) {
        return;
      }
      iVar1 = UnityIsOneArrayNull(expected,actual,lineNumber,msg);
      if (iVar1 == 0) {
        if (num_elements == 0) {
          return;
        }
        lVar2 = (ulong)(length - 1) + 1;
        pvVar4 = expected;
        UVar6 = num_elements;
        do {
          pvVar3 = pvVar4;
          pvVar5 = actual;
          if (length != 0) {
            pvVar3 = (void *)(lVar2 + (long)pvVar4);
            pvVar5 = (void *)((long)actual + lVar2);
            number = 0;
            do {
              if (*(char *)((long)pvVar4 + number) != *(char *)((long)actual + number)) {
                UnityTestResultsFailBegin(lineNumber);
                UnityPrint(" Memory Mismatch.");
                if (num_elements != 1) {
                  UnityPrint(" Element ");
                  UnityPrintNumberUnsigned((ulong)(num_elements - UVar6));
                }
                UnityPrint(" Byte ");
                UnityPrintNumberUnsigned(number);
                UnityPrint(" Expected ");
                UnityPrintNumberByStyle
                          ((ulong)*(byte *)((long)pvVar4 + number),UNITY_DISPLAY_STYLE_HEX8);
                UnityPrint(" Was ");
                UnityPrintNumberByStyle
                          ((ulong)*(byte *)((long)actual + number),UNITY_DISPLAY_STYLE_HEX8);
                goto LAB_00102c1d;
              }
              number = number + 1;
            } while (length != (UNITY_UINT32)number);
          }
          UVar6 = UVar6 - 1;
          pvVar4 = pvVar3;
          if (flags == UNITY_ARRAY_TO_VAL) {
            pvVar4 = expected;
          }
          actual = pvVar5;
          if (UVar6 == 0) {
            return;
          }
        } while( true );
      }
    }
    Unity.CurrentTestFailed = 1;
  }
  longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
}

Assistant:

void UnityAssertEqualMemory(UNITY_INTERNAL_PTR expected,
                            UNITY_INTERNAL_PTR actual,
                            const UNITY_UINT32 length,
                            const UNITY_UINT32 num_elements,
                            const char* msg,
                            const UNITY_LINE_TYPE lineNumber,
                            const UNITY_FLAGS_T flags)
{
    UNITY_PTR_ATTRIBUTE const unsigned char* ptr_exp = (UNITY_PTR_ATTRIBUTE const unsigned char*)expected;
    UNITY_PTR_ATTRIBUTE const unsigned char* ptr_act = (UNITY_PTR_ATTRIBUTE const unsigned char*)actual;
    UNITY_UINT32 elements = num_elements;
    UNITY_UINT32 bytes;

    RETURN_IF_FAIL_OR_IGNORE;

    if ((elements == 0) || (length == 0))
    {
        UnityPrintPointlessAndBail();
    }

    if (expected == actual)
    {
        return; /* Both are NULL or same pointer */
    }

    if (UnityIsOneArrayNull(expected, actual, lineNumber, msg))
    {
        UNITY_FAIL_AND_BAIL;
    }

    while (elements--)
    {
        bytes = length;
        while (bytes--)
        {
            if (*ptr_exp != *ptr_act)
            {
                UnityTestResultsFailBegin(lineNumber);
                UnityPrint(UnityStrMemory);
                if (num_elements > 1)
                {
                    UnityPrint(UnityStrElement);
                    UnityPrintNumberUnsigned(num_elements - elements - 1);
                }
                UnityPrint(UnityStrByte);
                UnityPrintNumberUnsigned(length - bytes - 1);
                UnityPrint(UnityStrExpected);
                UnityPrintNumberByStyle(*ptr_exp, UNITY_DISPLAY_STYLE_HEX8);
                UnityPrint(UnityStrWas);
                UnityPrintNumberByStyle(*ptr_act, UNITY_DISPLAY_STYLE_HEX8);
                UnityAddMsgIfSpecified(msg);
                UNITY_FAIL_AND_BAIL;
            }
            ptr_exp++;
            ptr_act++;
        }
        if (flags == UNITY_ARRAY_TO_VAL)
        {
            ptr_exp = (UNITY_PTR_ATTRIBUTE const unsigned char*)expected;
        }
    }
}